

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cardinality_estimator.cpp
# Opt level: O1

double __thiscall
duckdb::CardinalityEstimator::CalculateUpdatedDenom
          (CardinalityEstimator *this,Subgraph2Denominator left,Subgraph2Denominator right,
          FilterInfoWithTotalDomains *filter)

{
  JoinType JVar1;
  FilterInfo *pFVar2;
  optional_ptr<duckdb::JoinRelationSet,_true> oVar3;
  bool bVar4;
  ulong uVar5;
  double dVar6;
  ExpressionType comparison_type;
  byte local_51;
  double local_50;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  
  local_50 = left.denom * right.denom;
  optional_ptr<duckdb::FilterInfo,_true>::CheckValid(&filter->filter_info);
  JVar1 = ((filter->filter_info).ptr)->join_type;
  if (JVar1 - 5 < 2) {
    optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid(&left.relations);
    oVar3 = left.relations;
    optional_ptr<duckdb::FilterInfo,_true>::CheckValid(&filter->filter_info);
    pFVar2 = (filter->filter_info).ptr;
    optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid(&pFVar2->left_set);
    bVar4 = JoinRelationSet::IsSubset(oVar3.ptr,(pFVar2->left_set).ptr);
    if (bVar4) {
      optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid(&right.relations);
      oVar3 = right.relations;
      optional_ptr<duckdb::FilterInfo,_true>::CheckValid(&filter->filter_info);
      pFVar2 = (filter->filter_info).ptr;
      optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid(&pFVar2->right_set);
      bVar4 = JoinRelationSet::IsSubset(oVar3.ptr,(pFVar2->right_set).ptr);
      if (bVar4) {
        right.denom = left.denom;
      }
    }
    local_50 = right.denom * 5.0;
  }
  else if (JVar1 == INNER) {
    local_51 = 0;
    optional_ptr<duckdb::FilterInfo,_true>::CheckValid(&filter->filter_info);
    local_48._8_8_ = 0;
    pcStack_30 = ::std::
                 _Function_handler<void_(duckdb::Expression_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/join_order/cardinality_estimator.cpp:223:71)>
                 ::_M_invoke;
    local_38 = ::std::
               _Function_handler<void_(duckdb::Expression_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/join_order/cardinality_estimator.cpp:223:71)>
               ::_M_manager;
    local_48._M_unused._M_object = &local_51;
    ExpressionIterator::EnumerateExpression
              (&((filter->filter_info).ptr)->filter,
               (function<void_(duckdb::Expression_&)> *)&local_48);
    if (local_38 != (code *)0x0) {
      (*local_38)(&local_48,&local_48,__destroy_functor);
    }
    uVar5 = (ulong)local_51;
    dVar6 = 1.0;
    if (uVar5 < 0x29) {
      if ((0x207c000000U >> (uVar5 & 0x3f) & 1) == 0) {
        if (((0x10002000000U >> (uVar5 & 0x3f) & 1) != 0) || (uVar5 == 0)) {
          dVar6 = ((double)CONCAT44(0x45300000,
                                    (int)((&filter->tdom_hll)[filter->has_tdom_hll ^ 1] >> 0x20)) -
                  1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)(&filter->tdom_hll)[filter->has_tdom_hll ^ 1]) -
                  4503599627370496.0);
        }
      }
      else {
        dVar6 = pow(((double)CONCAT44(0x45300000,
                                      (int)((&filter->tdom_hll)[filter->has_tdom_hll ^ 1] >> 0x20))
                    - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)(&filter->tdom_hll)[filter->has_tdom_hll ^ 1])
                    - 4503599627370496.0),0.6666666666666666);
      }
    }
    local_50 = local_50 * dVar6;
  }
  return local_50;
}

Assistant:

double CardinalityEstimator::CalculateUpdatedDenom(Subgraph2Denominator left, Subgraph2Denominator right,
                                                   FilterInfoWithTotalDomains &filter) {
	double new_denom = left.denom * right.denom;
	switch (filter.filter_info->join_type) {
	case JoinType::INNER: {
		// Collect comparison types
		ExpressionType comparison_type = ExpressionType::INVALID;
		ExpressionIterator::EnumerateExpression(filter.filter_info->filter, [&](Expression &expr) {
			if (expr.GetExpressionClass() == ExpressionClass::BOUND_COMPARISON) {
				comparison_type = expr.GetExpressionType();
			}
		});
		if (comparison_type == ExpressionType::INVALID) {
			new_denom *=
			    filter.has_tdom_hll ? static_cast<double>(filter.tdom_hll) : static_cast<double>(filter.tdom_no_hll);
			// no comparison is taking place, so the denominator is just the product of the left and right
			return new_denom;
		}
		// extra_ratio helps represents how many tuples will be filtered out if the comparison evaluates to
		// false. set to 1 to assume cross product.
		double extra_ratio = 1;
		switch (comparison_type) {
		case ExpressionType::COMPARE_EQUAL:
		case ExpressionType::COMPARE_NOT_DISTINCT_FROM:
			// extra ratio stays 1
			extra_ratio =
			    filter.has_tdom_hll ? static_cast<double>(filter.tdom_hll) : static_cast<double>(filter.tdom_no_hll);
			break;
		case ExpressionType::COMPARE_LESSTHANOREQUALTO:
		case ExpressionType::COMPARE_LESSTHAN:
		case ExpressionType::COMPARE_GREATERTHANOREQUALTO:
		case ExpressionType::COMPARE_GREATERTHAN:
		case ExpressionType::COMPARE_NOTEQUAL:
		case ExpressionType::COMPARE_DISTINCT_FROM:
			// Assume this blows up, but use the tdom to bound it a bit
			extra_ratio =
			    filter.has_tdom_hll ? static_cast<double>(filter.tdom_hll) : static_cast<double>(filter.tdom_no_hll);
			extra_ratio = pow(extra_ratio, 2.0 / 3.0);
			break;
		default:
			break;
		}
		new_denom *= extra_ratio;
		return new_denom;
	}
	case JoinType::SEMI:
	case JoinType::ANTI: {
		if (JoinRelationSet::IsSubset(*left.relations, *filter.filter_info->left_set) &&
		    JoinRelationSet::IsSubset(*right.relations, *filter.filter_info->right_set)) {
			new_denom = left.denom * CardinalityEstimator::DEFAULT_SEMI_ANTI_SELECTIVITY;
			return new_denom;
		}
		new_denom = right.denom * CardinalityEstimator::DEFAULT_SEMI_ANTI_SELECTIVITY;
		return new_denom;
	}
	default:
		// cross product
		return new_denom;
	}
}